

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O2

int proxy_client_recv(proxy_client_handle *ch,proxy_msg *msg,uint8_t *buff,size_t buff_len)

{
  conn_handle *conn;
  int iVar1;
  ulong buff_len_00;
  
  conn = (conn_handle *)ch->priv;
  iVar1 = conn_recv(conn,&msg->type,9);
  if ((-1 < iVar1) && (buff_len_00 = (ulong)msg->size, buff_len_00 != 0)) {
    if (buff_len_00 <= buff_len) {
      iVar1 = conn_recv(conn,buff,buff_len_00);
      return iVar1;
    }
    iVar1 = -0x1c;
  }
  return iVar1;
}

Assistant:

int proxy_client_recv(struct proxy_client_handle *ch, struct proxy_msg *msg,
                      uint8_t *buff, size_t buff_len)
{
	struct proxy_client_priv *priv = ch->priv;
	int ret;

	ret = conn_recv(&priv->conn, (uint8_t *)msg, sizeof(*msg));
	if (ret >= 0 && msg->size > 0) {
		if (msg->size > buff_len)
			return -ENOSPC;
		ret = conn_recv(&priv->conn, buff, msg->size);
	}

	return ret;
}